

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_ImpactGenerator.cpp
# Opt level: O2

ImpactInstance * ImpactGenerator::GetImpactInstance(int index)

{
  if (3 < (uint)index) {
    return (ImpactInstance *)0x0;
  }
  if (GetImpactInstance::initialized[(uint)index] == false) {
    GetImpactInstance::initialized[(uint)index] = true;
    GetImpactInstance::instance[(uint)index].maximpacts = 1000;
    GetImpactInstance::instance[(uint)index].numimpacts = 0;
  }
  return GetImpactInstance::instance + (uint)index;
}

Assistant:

inline ImpactInstance* GetImpactInstance(int index)
    {
        static bool initialized[MAXINSTANCES] = { false };
        static ImpactInstance instance[MAXINSTANCES];
        if (index < 0 || index >= MAXINSTANCES)
            return NULL;
        if (!initialized[index])
        {
            initialized[index] = true;
            instance[index].maximpacts = MAXIMPACTS;
            instance[index].numimpacts = 0;
        }
        return &instance[index];
    }